

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::ObjectivePropagation::ObjectivePropagation
          (ObjectivePropagation *this,HighsDomain *domain)

{
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *this_00;
  ulong uVar1;
  HighsInt *pHVar2;
  int iVar3;
  HighsMipSolver *pHVar4;
  HighsMipSolverData *pHVar5;
  pointer ppVar6;
  pointer pOVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  size_type __new_size;
  ulong uVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ObjectiveContributionTree contributionTree;
  value_type local_48;
  int *local_40;
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  *local_38;
  
  this->domain = domain;
  pHVar4 = domain->mipsolver;
  pHVar5 = (pHVar4->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this->objFunc = &pHVar5->objectiveFunction;
  this->cost = (pHVar4->model_->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->objectiveLowerContributions;
  (this->objectiveLowerContributions).
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objectiveLowerContributions).
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objectiveLowerContributions).
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->contributionPartitionSets).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->contributionPartitionSets).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->contributionPartitionSets).
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->propagationConsBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->partitionCliqueData).
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitionCliqueData).
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitionCliqueData).
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = (int)((ulong)((long)*(pointer *)
                                ((long)&(pHVar5->objectiveFunction).cliquePartitionStart + 8) -
                        *(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl) >> 2) - 1;
  if (uVar13 != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&this->propagationConsBuffer,&(pHVar5->objectiveFunction).objectiveVals);
    std::
    vector<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
    ::resize(&this->partitionCliqueData,
             ((long)(this->objFunc->cliquePartitionStart).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
             (long)(this->objFunc->cliquePartitionStart).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start) * 0x40000000 + -0x100000000 >> 0x20);
  }
  this->isPropagated = false;
  this->capacityThreshold = INFINITY;
  __new_size = (size_type)(int)uVar13;
  (this->objectiveLower).hi = 0.0;
  (this->objectiveLower).lo = 0.0;
  this->numInfObjLower = 0;
  std::
  vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ::resize(this_00,(long)*(int *)(*(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                 __new_size * 4));
  local_48.first = -1;
  local_48.second = -1;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::resize
            (&this->contributionPartitionSets,__new_size,&local_48);
  if (0 < (int)uVar13) {
    uVar11 = 0;
    do {
      ppVar6 = (this->contributionPartitionSets).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48 = (value_type)(ppVar6 + uVar11);
      local_40 = &ppVar6[uVar11].second;
      (this->partitionCliqueData).
      super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar11].rhs = 1;
      lVar14 = *(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
      iVar9 = *(int *)(lVar14 + uVar11 * 4);
      uVar15 = (ulong)iVar9;
      uVar1 = uVar11 + 1;
      local_38 = this_00;
      if (iVar9 < *(int *)(lVar14 + 4 + uVar11 * 4)) {
        lVar14 = uVar15 * 4;
        do {
          iVar9 = *(int *)(*(long *)&(pHVar5->objectiveFunction).objectiveNonzeros.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar14)
          ;
          pOVar7 = (this->objectiveLowerContributions).
                   super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (pOVar7->links).child[lVar14 * 2U + 0xfffffffffffffffe] = iVar9;
          (pOVar7->links).child[lVar14 * 2U + 0xffffffffffffffff] = (int)uVar11;
          pdVar10 = this->cost;
          dVar17 = pdVar10[iVar9];
          if (dVar17 <= 0.0) {
            *(double *)((pOVar7->links).child + lVar14 * 2U + 0xfffffffffffffffc) = -dVar17;
            dVar17 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar9];
            bVar16 = dVar17 == 1.0;
          }
          else {
            dVar19 = (this->objectiveLower).hi;
            dVar18 = dVar17 + dVar19;
            (this->objectiveLower).hi = dVar18;
            (this->objectiveLower).lo =
                 ((dVar18 - dVar17) - dVar18) + dVar17 + (dVar19 - (dVar18 - dVar17)) +
                 (this->objectiveLower).lo;
            *(double *)((pOVar7->links).child + lVar14 * 2U + 0xfffffffffffffffc) = pdVar10[iVar9];
            pHVar2 = &(this->partitionCliqueData).
                      super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar11].rhs;
            *pHVar2 = *pHVar2 + -1;
            dVar17 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar9];
            bVar16 = dVar17 == 0.0;
            pdVar10 = (double *)(uVar11 * 0x10);
          }
          if ((bVar16) && (!NAN(dVar17))) {
            ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::link
                      ((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                       &local_48,(char *)(uVar15 & 0xffffffff),(char *)pdVar10);
          }
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 4;
        } while ((long)uVar15 <
                 (long)*(int *)(*(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl +
                               uVar1 * 4));
      }
      if ((long)*local_40 != -1) {
        dVar17 = (this->objectiveLowerContributions).
                 super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ._M_impl.super__Vector_impl_data._M_start[*local_40].contribution;
        dVar19 = (this->objectiveLower).hi;
        dVar18 = dVar19 - dVar17;
        (this->objectiveLower).hi = dVar18;
        (this->objectiveLower).lo =
             (dVar19 - (dVar17 + dVar18)) + (-dVar17 - (dVar18 - (dVar17 + dVar18))) +
             (this->objectiveLower).lo;
      }
      uVar11 = uVar1;
    } while (uVar1 != uVar13);
  }
  lVar14 = *(long *)&(pHVar5->objectiveFunction).objectiveNonzeros.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl;
  iVar9 = *(int *)(*(long *)&(pHVar5->objectiveFunction).cliquePartitionStart.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + __new_size * 4)
  ;
  lVar8 = (long)iVar9;
  iVar12 = (int)((ulong)((long)*(pointer *)
                                ((long)&(pHVar5->objectiveFunction).objectiveNonzeros + 8) - lVar14)
                >> 2);
  if (iVar9 < iVar12) {
    iVar9 = this->numInfObjLower;
    dVar17 = (this->objectiveLower).lo;
    pdVar10 = this->cost;
    dVar19 = (this->objectiveLower).hi;
    do {
      iVar3 = *(int *)(lVar14 + lVar8 * 4);
      if (pdVar10[iVar3] <= 0.0) {
        dVar18 = (domain->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        if (dVar18 < INFINITY) goto LAB_0029705d;
LAB_0029703f:
        iVar9 = iVar9 + 1;
        this->numInfObjLower = iVar9;
        dVar20 = dVar19;
      }
      else {
        dVar18 = (domain->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar3];
        if (dVar18 <= -INFINITY) goto LAB_0029703f;
LAB_0029705d:
        dVar18 = pdVar10[iVar3] * dVar18;
        dVar20 = dVar18 + dVar19;
        (this->objectiveLower).hi = dVar20;
        dVar17 = dVar17 + (dVar19 - (dVar20 - dVar18)) + (dVar18 - (dVar20 - (dVar20 - dVar18)));
        (this->objectiveLower).lo = dVar17;
      }
      lVar8 = lVar8 + 1;
      dVar19 = dVar20;
    } while (iVar12 != lVar8);
  }
  recomputeCapacityThreshold(this);
  return;
}

Assistant:

HighsDomain::ObjectivePropagation::ObjectivePropagation(HighsDomain* domain)
    : domain(domain),
      objFunc(&domain->mipsolver->mipdata_->objectiveFunction),
      cost(domain->mipsolver->model_->col_cost_.data()) {
  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();

  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  if (numPartitions != 0) {
    propagationConsBuffer = objFunc->getObjectiveValuesPacked();
    partitionCliqueData.resize(objFunc->getNumCliquePartitions());
  }

  isPropagated = false;
  capacityThreshold = kHighsInf;
  objectiveLower = 0.0;
  numInfObjLower = 0;
  objectiveLowerContributions.resize(partitionStarts[numPartitions]);
  contributionPartitionSets.resize(numPartitions,
                                   std::make_pair(HighsInt{-1}, HighsInt{-1}));

  // for each clique partition first set up all columns as contributing with
  // their largest possible value and then remove the largest contribution of
  // each clique partition. For these columns we do not need to check for finite
  // bounds as they must be binary. We do not assume, however, that they must be
  // unfixed but could be fixed to 0 or 1. We maintain a heap that fulfills the
  // invariant that the largest column may be not fixed to its value with the
  // larger contribution.
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    partitionCliqueData[i].rhs = 1;
    for (HighsInt j = partitionStarts[i]; j < partitionStarts[i + 1]; ++j) {
      HighsInt col = objNonzeros[j];
      objectiveLowerContributions[j].col = col;
      objectiveLowerContributions[j].partition = i;
      if (cost[col] > 0.0) {
        objectiveLower += cost[col];
        objectiveLowerContributions[j].contribution = cost[col];
        partitionCliqueData[i].rhs -= 1;
        if (domain->col_lower_[col] == 0.0) contributionTree.link(j);
      } else {
        objectiveLowerContributions[j].contribution = -cost[col];
        if (domain->col_upper_[col] == 1.0) contributionTree.link(j);
      }
    }

    HighsInt worstPos = contributionTree.first();
    if (worstPos != -1)
      objectiveLower -= objectiveLowerContributions[worstPos].contribution;
  }

  // add contribution of remaining objective nonzeros
  const HighsInt numObjNz = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNz; ++i) {
    HighsInt col = objNonzeros[i];
    if (cost[col] > 0.0) {
      if (domain->col_lower_[col] == -kHighsInf)
        ++numInfObjLower;
      else
        objectiveLower += domain->col_lower_[col] * cost[col];
    } else {
      if (domain->col_upper_[col] == kHighsInf)
        ++numInfObjLower;
      else
        objectiveLower += domain->col_upper_[col] * cost[col];
    }
  }

  recomputeCapacityThreshold();
  debugCheckObjectiveLower();
}